

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  undefined1 uVar5;
  short sVar6;
  ushort uVar7;
  undefined8 uVar8;
  long lVar9;
  short sVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  stbi__uint32 sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  stbi__uint32 sVar24;
  int iVar25;
  int iVar26;
  stbi__jpeg *psVar27;
  char *pcVar28;
  long lVar29;
  uchar *puVar30;
  stbi_uc *psVar31;
  void *pvVar32;
  code *pcVar33;
  stbi__context *data_00;
  undefined8 *puVar34;
  stbi_uc *psVar35;
  stbi__uint16 *data_01;
  ulong uVar36;
  undefined8 *puVar37;
  undefined1 *puVar38;
  short sVar39;
  int id;
  uint uVar40;
  ulong uVar41;
  stbi__context *psVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar47;
  stbi__result_info *ri_00;
  stbi__jpeg *psVar48;
  int iVar49;
  stbi__uint32 sVar50;
  int iVar51;
  ulong uVar52;
  stbi_uc *psVar53;
  uint uVar54;
  uint uVar55;
  byte *pbVar56;
  stbi_uc **ppsVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  short *psVar61;
  stbi__uint16 *psVar62;
  long in_FS_OFFSET;
  bool bVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  stbi__uint16 *local_8988;
  stbi_uc *local_8968;
  uint local_8960;
  int local_8928;
  uint local_88fc;
  stbi_uc *coutput [4];
  int local_88d8;
  int local_88c4;
  int local_88c0;
  int local_88bc;
  short data [64];
  
  psVar35 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar27 = (stbi__jpeg *)malloc(0x4888);
  psVar27->s = s;
  psVar27->idct_block_kernel = stbi__idct_simd;
  psVar27->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar27->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar19 = stbi__decode_jpeg_header(psVar27,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar27);
  if (iVar19 != 0) {
    psVar27 = (stbi__jpeg *)malloc(0x4888);
    psVar27->s = s;
    psVar27->idct_block_kernel = stbi__idct_simd;
    psVar27->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar27->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar29 = 0x46d8; lVar29 != 0x4858; lVar29 = lVar29 + 0x60) {
        psVar35 = psVar27->huff_dc[0].fast + lVar29 + -8;
        psVar35[0] = '\0';
        psVar35[1] = '\0';
        psVar35[2] = '\0';
        psVar35[3] = '\0';
        psVar35[4] = '\0';
        psVar35[5] = '\0';
        psVar35[6] = '\0';
        psVar35[7] = '\0';
        psVar35[8] = '\0';
        psVar35[9] = '\0';
        psVar35[10] = '\0';
        psVar35[0xb] = '\0';
        psVar35[0xc] = '\0';
        psVar35[0xd] = '\0';
        psVar35[0xe] = '\0';
        psVar35[0xf] = '\0';
      }
      psVar27->restart_interval = 0;
      iVar19 = stbi__decode_jpeg_header(psVar27,0);
      if (iVar19 != 0) {
        paVar1 = psVar27->img_comp;
        bVar12 = stbi__get_marker(psVar27);
LAB_00159042:
        if (bVar12 != 0xda) {
          if (bVar12 == 0xdc) {
            iVar19 = stbi__get16be(psVar27->s);
            sVar20 = stbi__get16be(psVar27->s);
            if (iVar19 == 4) {
              if (sVar20 == psVar27->s->img_y) goto LAB_001590a5;
              pcVar28 = "bad DNL height";
            }
            else {
              pcVar28 = "bad DNL len";
            }
            goto LAB_0015a80f;
          }
          if (bVar12 != 0xd9) {
            iVar19 = stbi__process_marker(psVar27,(uint)bVar12);
            if (iVar19 != 0) goto LAB_001590a5;
            goto LAB_0015a818;
          }
          if (psVar27->progressive == 0) {
            psVar42 = psVar27->s;
            uVar58 = psVar42->img_n;
          }
          else {
            lVar29 = 0;
            while( true ) {
              psVar42 = psVar27->s;
              uVar58 = psVar42->img_n;
              if ((int)uVar58 <= lVar29) break;
              uVar58 = psVar27->img_comp[lVar29].x + 7 >> 3;
              iVar19 = psVar27->img_comp[lVar29].y + 7 >> 3;
              uVar52 = 0;
              uVar36 = (ulong)uVar58;
              if ((int)uVar58 < 1) {
                uVar36 = uVar52;
              }
              if (iVar19 < 1) {
                iVar19 = 0;
              }
              while (iVar26 = (int)uVar52, iVar26 != iVar19) {
                for (uVar52 = 0; uVar52 != uVar36; uVar52 = uVar52 + 1) {
                  psVar61 = paVar1[lVar29].coeff;
                  iVar43 = paVar1[lVar29].coeff_w * iVar26;
                  iVar49 = paVar1[lVar29].tq;
                  iVar44 = iVar43 + (int)uVar52;
                  for (lVar45 = 0; lVar45 != 0x40; lVar45 = lVar45 + 1) {
                    psVar61[iVar44 * 0x40 + lVar45] =
                         psVar61[iVar44 * 0x40 + lVar45] * psVar27->dequant[iVar49][lVar45];
                  }
                  (*psVar27->idct_block_kernel)
                            (paVar1[lVar29].data +
                             uVar52 * 8 + (long)(iVar26 * 8 * paVar1[lVar29].w2),paVar1[lVar29].w2,
                             psVar61 + (iVar43 + (int)uVar52) * 0x40);
                }
                uVar52 = (ulong)(iVar26 + 1);
              }
              lVar29 = lVar29 + 1;
            }
          }
          uVar40 = (2 < (int)uVar58) + 1 + (uint)(2 < (int)uVar58);
          if (req_comp != 0) {
            uVar40 = req_comp;
          }
          lVar29 = 0;
          bVar63 = false;
          if ((uVar58 == 3) && (bVar63 = true, psVar27->rgb != 3)) {
            if (psVar27->app14_color_transform == 0) {
              bVar63 = psVar27->jfif == 0;
            }
            else {
              bVar63 = false;
            }
          }
          uVar36 = 0;
          if (0 < (int)uVar58) {
            uVar36 = (ulong)uVar58;
          }
          uVar52 = 1;
          if (bVar63) {
            uVar52 = uVar36;
          }
          if (2 < (int)uVar40) {
            uVar52 = uVar36;
          }
          coutput[2] = (stbi_uc *)0x0;
          coutput[3] = (stbi_uc *)0x0;
          coutput[0] = (stbi_uc *)0x0;
          coutput[1] = (stbi_uc *)0x0;
          if (uVar58 != 3) {
            uVar52 = uVar36;
          }
          do {
            if (uVar52 * 0x30 == lVar29) {
              sVar20 = psVar42->img_y;
              data_00 = (stbi__context *)stbi__malloc_mad3(uVar40,psVar42->img_x,sVar20,1);
              if (data_00 != (stbi__context *)0x0) {
                iVar19 = 0;
                uVar58 = 0;
                do {
                  if (sVar20 <= uVar58) {
                    stbi__cleanup_jpeg(psVar27);
                    psVar42 = psVar27->s;
                    *x = psVar42->img_x;
                    *y = psVar42->img_y;
                    if (comp != (int *)0x0) {
                      *comp = (uint)(2 < psVar42->img_n) * 2 + 1;
                    }
                    goto LAB_0015a827;
                  }
                  sVar20 = psVar42->img_x;
                  ppsVar57 = coutput;
                  for (lVar29 = 0; uVar52 * 0x30 != lVar29; lVar29 = lVar29 + 0x30) {
                    puVar34 = (undefined8 *)((long)data + lVar29 + 0x10);
                    iVar26 = *(int *)((long)data + lVar29 + 0x24);
                    iVar49 = *(int *)((long)data + lVar29 + 0x1c);
                    iVar43 = iVar49 >> 1;
                    puVar2 = (undefined8 *)((long)data + lVar29 + 8);
                    puVar37 = puVar34;
                    if (iVar26 < iVar43) {
                      puVar37 = puVar2;
                    }
                    if (iVar43 <= iVar26) {
                      puVar34 = puVar2;
                    }
                    psVar35 = (stbi_uc *)
                              (**(code **)((long)data + lVar29))
                                        (*(undefined8 *)
                                          ((long)&psVar27->img_comp[0].linebuf + lVar29 * 2),
                                         *puVar37,*puVar34,
                                         *(undefined4 *)((long)data + lVar29 + 0x20));
                    *ppsVar57 = psVar35;
                    *(int *)((long)data + lVar29 + 0x24) = iVar26 + 1;
                    if (iVar49 <= iVar26 + 1) {
                      *(undefined4 *)((long)data + lVar29 + 0x24) = 0;
                      lVar45 = *(long *)((long)data + lVar29 + 0x10);
                      *(long *)((long)data + lVar29 + 8) = lVar45;
                      iVar26 = *(int *)((long)data + lVar29 + 0x28) + 1;
                      *(int *)((long)data + lVar29 + 0x28) = iVar26;
                      if (iVar26 < *(int *)((long)&psVar27->img_comp[0].y + lVar29 * 2)) {
                        *(long *)((long)data + lVar29 + 0x10) =
                             lVar45 + *(int *)((long)&psVar27->img_comp[0].w2 + lVar29 * 2);
                      }
                    }
                    ppsVar57 = ppsVar57 + 1;
                  }
                  if ((int)uVar40 < 3) {
                    psVar42 = psVar27->s;
                    if (bVar63) {
                      uVar36 = (ulong)(sVar20 * iVar19);
                      if (uVar40 == 1) {
                        for (uVar46 = 0; uVar46 < psVar42->img_x; uVar46 = uVar46 + 1) {
                          data_00->buffer_start[uVar46 + uVar36 + -0x38] =
                               (stbi_uc)((uint)coutput[2][uVar46] * 0x1d +
                                         (uint)coutput[1][uVar46] * 0x96 +
                                         (uint)coutput[0][uVar46] * 0x4d >> 8);
                        }
                      }
                      else {
                        for (uVar46 = 0; uVar46 < psVar42->img_x; uVar46 = uVar46 + 1) {
                          data_00->buffer_start[uVar46 * 2 + uVar36 + -0x38] =
                               (stbi_uc)((uint)coutput[2][uVar46] * 0x1d +
                                         (uint)coutput[1][uVar46] * 0x96 +
                                         (uint)coutput[0][uVar46] * 0x4d >> 8);
                          data_00->buffer_start[uVar46 * 2 + uVar36 + -0x37] = 0xff;
                        }
                      }
                    }
                    else if (psVar42->img_n == 4) {
                      if (psVar27->app14_color_transform == 2) {
                        psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                        for (uVar36 = 0; uVar36 < psVar42->img_x; uVar36 = uVar36 + 1) {
                          iVar26 = (coutput[0][uVar36] ^ 0xff) * (uint)coutput[3][uVar36];
                          psVar35[-1] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                          *psVar35 = 0xff;
                          psVar35 = psVar35 + uVar40;
                        }
                      }
                      else {
                        if (psVar27->app14_color_transform != 0) goto LAB_0015b3cc;
                        psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                        for (uVar36 = 0; uVar36 < psVar42->img_x; uVar36 = uVar36 + 1) {
                          bVar12 = coutput[3][uVar36];
                          iVar26 = (uint)coutput[0][uVar36] * (uint)bVar12;
                          iVar49 = (uint)coutput[1][uVar36] * (uint)bVar12;
                          psVar35[-1] = (char)((((uint)coutput[2][uVar36] * (uint)bVar12 + 0x80 >> 8
                                                ) + (uint)coutput[2][uVar36] * (uint)bVar12 + 0x80
                                               >> 8) * 0x1d +
                                               (iVar49 + (iVar49 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar26 + (iVar26 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar35 = 0xff;
                          psVar35 = psVar35 + uVar40;
                        }
                      }
                    }
                    else {
LAB_0015b3cc:
                      uVar36 = (ulong)(sVar20 * iVar19);
                      if (uVar40 == 1) {
                        for (uVar46 = 0; uVar46 < psVar42->img_x; uVar46 = uVar46 + 1) {
                          data_00->buffer_start[uVar46 + uVar36 + -0x38] = coutput[0][uVar46];
                        }
                      }
                      else {
                        for (uVar46 = 0; uVar46 < psVar42->img_x; uVar46 = uVar46 + 1) {
                          data_00->buffer_start[uVar46 * 2 + uVar36 + -0x38] = coutput[0][uVar46];
                          data_00->buffer_start[uVar46 * 2 + uVar36 + -0x37] = 0xff;
                        }
                      }
                    }
                  }
                  else {
                    psVar42 = psVar27->s;
                    if (psVar42->img_n == 3) {
                      if (bVar63) {
                        psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                        for (uVar36 = 0; uVar36 < psVar42->img_x; uVar36 = uVar36 + 1) {
                          psVar35[-3] = coutput[0][uVar36];
                          psVar35[-2] = coutput[1][uVar36];
                          psVar35[-1] = coutput[2][uVar36];
                          *psVar35 = 0xff;
                          psVar35 = psVar35 + uVar40;
                        }
                      }
                      else {
LAB_0015b402:
                        (*psVar27->YCbCr_to_RGB_kernel)
                                  (data_00->buffer_start +
                                   ((ulong)(uVar58 * uVar40 * sVar20) - 0x38),coutput[0],coutput[1],
                                   coutput[2],psVar42->img_x,uVar40);
                      }
                    }
                    else if (psVar42->img_n == 4) {
                      if (psVar27->app14_color_transform == 2) {
                        (*psVar27->YCbCr_to_RGB_kernel)
                                  (data_00->buffer_start +
                                   ((ulong)(uVar58 * uVar40 * sVar20) - 0x38),coutput[0],coutput[1],
                                   coutput[2],psVar42->img_x,uVar40);
                        psVar42 = psVar27->s;
                        psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x36);
                        for (uVar36 = 0; uVar36 < psVar42->img_x; uVar36 = uVar36 + 1) {
                          bVar12 = coutput[3][uVar36];
                          iVar26 = (psVar35[-2] ^ 0xff) * (uint)bVar12;
                          psVar35[-2] = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                          iVar26 = (psVar35[-1] ^ 0xff) * (uint)bVar12;
                          psVar35[-1] = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                          iVar26 = (*psVar35 ^ 0xff) * (uint)bVar12;
                          *psVar35 = (byte)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                          psVar35 = psVar35 + uVar40;
                        }
                      }
                      else {
                        if (psVar27->app14_color_transform != 0) goto LAB_0015b402;
                        psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                        for (uVar36 = 0; uVar36 < psVar42->img_x; uVar36 = uVar36 + 1) {
                          bVar12 = coutput[3][uVar36];
                          iVar26 = (uint)coutput[0][uVar36] * (uint)bVar12;
                          psVar35[-3] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                          iVar26 = (uint)coutput[1][uVar36] * (uint)bVar12;
                          psVar35[-2] = (char)((iVar26 + 0x80U >> 8) + iVar26 + 0x80 >> 8);
                          psVar35[-1] = (char)(((uint)coutput[2][uVar36] * (uint)bVar12 + 0x80 >> 8)
                                               + (uint)coutput[2][uVar36] * (uint)bVar12 + 0x80 >> 8
                                              );
                          *psVar35 = 0xff;
                          psVar35 = psVar35 + uVar40;
                        }
                      }
                    }
                    else {
                      psVar35 = data_00->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar36 = 0; uVar36 < psVar42->img_x; uVar36 = uVar36 + 1) {
                        sVar14 = coutput[0][uVar36];
                        psVar35[-1] = sVar14;
                        psVar35[-2] = sVar14;
                        psVar35[-3] = sVar14;
                        *psVar35 = 0xff;
                        psVar35 = psVar35 + uVar40;
                      }
                    }
                  }
                  uVar58 = uVar58 + 1;
                  psVar42 = psVar27->s;
                  sVar20 = psVar42->img_y;
                  iVar19 = iVar19 + uVar40;
                } while( true );
              }
              stbi__cleanup_jpeg(psVar27);
LAB_0015b5ad:
              pcVar28 = "outofmem";
              goto LAB_00158f5f;
            }
            sVar20 = psVar42->img_x;
            pvVar32 = malloc((ulong)(sVar20 + 3));
            *(void **)((long)&psVar27->img_comp[0].linebuf + lVar29 * 2) = pvVar32;
            if (pvVar32 == (void *)0x0) {
              stbi__cleanup_jpeg(psVar27);
              goto LAB_0015b5ad;
            }
            uVar36 = (long)psVar27->img_h_max /
                     (long)*(int *)((long)&psVar27->img_comp[0].h + lVar29 * 2);
            iVar19 = (int)uVar36;
            *(int *)((long)data + lVar29 + 0x18) = iVar19;
            iVar26 = psVar27->img_v_max / *(int *)((long)&psVar27->img_comp[0].v + lVar29 * 2);
            *(int *)((long)data + lVar29 + 0x1c) = iVar26;
            *(int *)((long)data + lVar29 + 0x24) = iVar26 >> 1;
            *(int *)((long)data + lVar29 + 0x20) =
                 (int)((ulong)((sVar20 + iVar19) - 1) / (uVar36 & 0xffffffff));
            *(undefined4 *)((long)data + lVar29 + 0x28) = 0;
            uVar8 = *(undefined8 *)((long)&psVar27->img_comp[0].data + lVar29 * 2);
            *(undefined8 *)((long)data + lVar29 + 0x10) = uVar8;
            *(undefined8 *)((long)data + lVar29 + 8) = uVar8;
            if (iVar19 == 2) {
              pcVar33 = stbi__resample_row_h_2;
              if (iVar26 != 1) {
                if (iVar26 != 2) goto LAB_0015af46;
                pcVar33 = psVar27->resample_row_hv_2_kernel;
              }
            }
            else if (iVar19 == 1) {
              pcVar33 = stbi__resample_row_generic;
              if (iVar26 == 2) {
                pcVar33 = stbi__resample_row_v_2;
              }
              if (iVar26 == 1) {
                pcVar33 = resample_row_1;
              }
            }
            else {
LAB_0015af46:
              pcVar33 = stbi__resample_row_generic;
            }
            *(code **)((long)data + lVar29) = pcVar33;
            lVar29 = lVar29 + 0x30;
          } while( true );
        }
        iVar19 = stbi__get16be(psVar27->s);
        bVar12 = stbi__get8(psVar27->s);
        uVar58 = (uint)bVar12;
        psVar27->scan_n = (uint)bVar12;
        if (((byte)(bVar12 - 5) < 0xfc) ||
           (psVar42 = psVar27->s, psVar42->img_n < (int)(uint)bVar12)) {
          pcVar28 = "bad SOS component count";
        }
        else {
          if (iVar19 == (uint)bVar12 * 2 + 6) {
            lVar29 = 0;
            while( true ) {
              bVar12 = stbi__get8(psVar42);
              if ((int)uVar58 <= lVar29) break;
              bVar13 = stbi__get8(psVar27->s);
              psVar42 = psVar27->s;
              uVar58 = psVar42->img_n;
              uVar36 = 0;
              if (0 < (int)uVar58) {
                uVar36 = (ulong)uVar58;
              }
              paVar47 = paVar1;
              for (uVar52 = 0; uVar36 != uVar52; uVar52 = uVar52 + 1) {
                if (paVar47->id == (uint)bVar12) {
                  uVar36 = uVar52 & 0xffffffff;
                  break;
                }
                paVar47 = paVar47 + 1;
              }
              if ((uint)uVar36 == uVar58) goto LAB_0015a818;
              psVar27->img_comp[uVar36].hd = (uint)(bVar13 >> 4);
              if (0x3f < bVar13) {
                pcVar28 = "bad DC huff";
                goto LAB_0015a80f;
              }
              paVar1[uVar36].ha = bVar13 & 0xf;
              if (3 < (bVar13 & 0xf)) {
                pcVar28 = "bad AC huff";
                goto LAB_0015a80f;
              }
              psVar27->order[lVar29] = (uint)uVar36;
              lVar29 = lVar29 + 1;
              uVar58 = psVar27->scan_n;
            }
            psVar27->spec_start = (uint)bVar12;
            bVar12 = stbi__get8(psVar27->s);
            psVar27->spec_end = (uint)bVar12;
            bVar12 = stbi__get8(psVar27->s);
            psVar27->succ_high = (uint)(bVar12 >> 4);
            psVar27->succ_low = bVar12 & 0xf;
            iVar19 = psVar27->spec_start;
            if (psVar27->progressive == 0) {
              if (((iVar19 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                psVar27->spec_end = 0x3f;
                goto LAB_00159243;
              }
            }
            else if (((iVar19 < 0x40) && (psVar27->spec_end < 0x40)) &&
                    ((iVar19 <= psVar27->spec_end && ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe))))))
            {
LAB_00159243:
              stbi__jpeg_reset(psVar27);
              if (psVar27->progressive == 0) {
                if (psVar27->scan_n == 1) {
                  iVar19 = psVar27->order[0];
                  uVar58 = psVar27->img_comp[iVar19].x + 7 >> 3;
                  iVar26 = psVar27->img_comp[iVar19].y + 7 >> 3;
                  if ((int)uVar58 < 1) {
                    uVar58 = 0;
                  }
                  iVar49 = 0;
                  if (iVar26 < 1) {
                    iVar26 = 0;
                  }
                  for (iVar43 = 0; iVar43 != iVar26; iVar43 = iVar43 + 1) {
                    for (lVar29 = 0; (ulong)uVar58 * 8 != lVar29; lVar29 = lVar29 + 8) {
                      iVar44 = stbi__jpeg_decode_block
                                         (psVar27,data,
                                          (stbi__huffman *)psVar27->huff_dc[paVar1[iVar19].hd].fast,
                                          (stbi__huffman *)psVar27->huff_ac[paVar1[iVar19].ha].fast,
                                          psVar27->fast_ac[paVar1[iVar19].ha],iVar19,
                                          psVar27->dequant[paVar1[iVar19].tq]);
                      if (iVar44 == 0) {
                        bVar63 = false;
                        goto LAB_00159ace;
                      }
                      (*psVar27->idct_block_kernel)
                                (paVar1[iVar19].data + lVar29 + iVar49 * paVar1[iVar19].w2,
                                 paVar1[iVar19].w2,data);
                      iVar44 = psVar27->todo;
                      psVar27->todo = iVar44 + -1;
                      if (iVar44 < 2) {
                        if (psVar27->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar27);
                        }
                        if ((psVar27->marker & 0xf8) != 0xd0) goto LAB_00159acb;
                        stbi__jpeg_reset(psVar27);
                      }
                    }
                    iVar49 = iVar49 + 8;
                  }
                }
                else {
                  for (iVar19 = 0; iVar19 < psVar27->img_mcu_y; iVar19 = iVar19 + 1) {
                    for (iVar26 = 0; iVar26 < psVar27->img_mcu_x; iVar26 = iVar26 + 1) {
                      for (lVar29 = 0; lVar29 < psVar27->scan_n; lVar29 = lVar29 + 1) {
                        iVar49 = psVar27->order[lVar29];
                        for (iVar43 = 0; iVar43 < paVar1[iVar49].v; iVar43 = iVar43 + 1) {
                          for (iVar44 = 0; iVar21 = paVar1[iVar49].h, iVar44 < iVar21;
                              iVar44 = iVar44 + 1) {
                            iVar22 = paVar1[iVar49].v;
                            iVar23 = stbi__jpeg_decode_block
                                               (psVar27,data,
                                                (stbi__huffman *)
                                                psVar27->huff_dc[paVar1[iVar49].hd].fast,
                                                (stbi__huffman *)
                                                psVar27->huff_ac[paVar1[iVar49].ha].fast,
                                                psVar27->fast_ac[paVar1[iVar49].ha],iVar49,
                                                psVar27->dequant[paVar1[iVar49].tq]);
                            if (iVar23 == 0) {
                              bVar63 = false;
                              goto LAB_00159ace;
                            }
                            (*psVar27->idct_block_kernel)
                                      (paVar1[iVar49].data +
                                       (long)((iVar21 * iVar26 + iVar44) * 8) +
                                       (long)((iVar22 * iVar19 + iVar43) * paVar1[iVar49].w2 * 8),
                                       paVar1[iVar49].w2,data);
                          }
                        }
                      }
                      iVar49 = psVar27->todo;
                      psVar27->todo = iVar49 + -1;
                      if (iVar49 < 2) {
                        if (psVar27->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar27);
                        }
                        if ((psVar27->marker & 0xf8) != 0xd0) goto LAB_00159acb;
                        stbi__jpeg_reset(psVar27);
                      }
                    }
                  }
                }
LAB_00159acb:
                bVar63 = true;
LAB_00159ace:
                if (!bVar63) goto LAB_0015a818;
              }
              else if (psVar27->scan_n == 1) {
                iVar19 = psVar27->order[0];
                iVar26 = psVar27->img_comp[iVar19].x + 7 >> 3;
                iVar49 = psVar27->img_comp[iVar19].y + 7 >> 3;
                iVar43 = 0;
                if (iVar26 < 1) {
                  iVar26 = iVar43;
                }
                if (iVar49 < 1) {
                  iVar49 = iVar43;
                }
                for (; iVar43 != iVar49; iVar43 = iVar43 + 1) {
                  for (iVar44 = 0; iVar44 != iVar26; iVar44 = iVar44 + 1) {
                    psVar61 = paVar1[iVar19].coeff +
                              (paVar1[iVar19].coeff_w * iVar43 + iVar44) * 0x40;
                    uVar36 = (ulong)psVar27->spec_start;
                    if (uVar36 == 0) {
                      iVar21 = stbi__jpeg_decode_block_prog_dc
                                         (psVar27,psVar61,
                                          (stbi__huffman *)psVar27->huff_dc[paVar1[iVar19].hd].fast,
                                          iVar19);
                      if (iVar21 == 0) goto LAB_0015a818;
                    }
                    else {
                      iVar21 = paVar1[iVar19].ha;
                      psVar35 = psVar27->huff_ac[iVar21].fast;
                      iVar22 = psVar27->eob_run;
                      bVar12 = (byte)psVar27->succ_low;
                      if (psVar27->succ_high == 0) {
                        if (iVar22 == 0) {
                          do {
                            if (psVar27->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar27);
                            }
                            sVar39 = psVar27->fast_ac[iVar21][psVar27->code_buffer >> 0x17];
                            uVar58 = (uint)sVar39;
                            iVar22 = (int)uVar36;
                            if (sVar39 == 0) {
                              uVar58 = stbi__jpeg_huff_decode(psVar27,(stbi__huffman *)psVar35);
                              if ((int)uVar58 < 0) goto LAB_0015a17c;
                              uVar40 = uVar58 >> 4;
                              if ((uVar58 & 0xf) == 0) {
                                if (uVar58 < 0xf0) {
                                  iVar22 = 1 << ((byte)uVar40 & 0x1f);
                                  psVar27->eob_run = iVar22;
                                  if (0xf < uVar58) {
                                    iVar22 = stbi__jpeg_get_bits(psVar27,uVar40);
                                    iVar22 = iVar22 + psVar27->eob_run;
                                  }
                                  goto LAB_001593ea;
                                }
                                uVar36 = (ulong)(iVar22 + 0x10);
                              }
                              else {
                                lVar29 = (ulong)uVar40 + (long)iVar22;
                                uVar36 = (ulong)((int)lVar29 + 1);
                                bVar13 = ""[lVar29];
                                iVar22 = stbi__extend_receive(psVar27,uVar58 & 0xf);
                                psVar61[bVar13] = (short)(iVar22 << (bVar12 & 0x1f));
                              }
                            }
                            else {
                              lVar29 = (ulong)(uVar58 >> 4 & 0xf) + (long)iVar22;
                              psVar27->code_buffer = psVar27->code_buffer << (sbyte)(uVar58 & 0xf);
                              psVar27->code_bits = psVar27->code_bits - (uVar58 & 0xf);
                              uVar36 = (ulong)((int)lVar29 + 1);
                              psVar61[""[lVar29]] = (short)((uVar58 >> 8) << (bVar12 & 0x1f));
                            }
                          } while ((int)uVar36 <= psVar27->spec_end);
                        }
                        else {
LAB_001593ea:
                          psVar27->eob_run = iVar22 + -1;
                        }
                      }
                      else if (iVar22 == 0) {
                        iVar21 = 0x10000 << (bVar12 & 0x1f);
                        do {
                          uVar58 = stbi__jpeg_huff_decode(psVar27,(stbi__huffman *)psVar35);
                          if ((int)uVar58 < 0) goto LAB_0015a17c;
                          uVar40 = uVar58 >> 4;
                          if ((uVar58 & 0xf) == 1) {
                            iVar22 = stbi__jpeg_get_bit(psVar27);
                            iVar23 = 1;
                            if (iVar22 == 0) {
                              iVar23 = 0xffff;
                            }
                            sVar39 = (short)(iVar23 << (bVar12 & 0x1f));
                          }
                          else {
                            if ((uVar58 & 0xf) != 0) {
                              pcVar28 = "bad huffman code";
                              goto LAB_0015a80f;
                            }
                            if (uVar58 < 0xf0) {
                              psVar27->eob_run = ~(-1 << ((byte)uVar40 & 0x1f));
                              if (0xf < uVar58) {
                                iVar22 = stbi__jpeg_get_bits(psVar27,uVar40);
                                psVar27->eob_run = psVar27->eob_run + iVar22;
                              }
                              uVar40 = 0x40;
                            }
                            else {
                              uVar40 = 0xf;
                            }
                            sVar39 = 0;
                          }
                          uVar52 = (long)(int)uVar36;
                          do {
                            while( true ) {
                              uVar36 = uVar52;
                              iVar22 = psVar27->spec_end;
                              if ((long)iVar22 < (long)uVar36) goto LAB_00159519;
                              bVar13 = ""[uVar36];
                              if (psVar61[bVar13] == 0) break;
                              iVar22 = stbi__jpeg_get_bit(psVar27);
                              if ((iVar22 != 0) &&
                                 (sVar6 = psVar61[bVar13], (iVar21 >> 0x10 & (int)sVar6) == 0)) {
                                sVar10 = (short)((uint)iVar21 >> 0x10);
                                if (sVar6 < 1) {
                                  sVar10 = -sVar10;
                                }
                                psVar61[bVar13] = sVar6 + sVar10;
                              }
                              uVar52 = uVar36 + 1;
                            }
                            bVar63 = uVar40 != 0;
                            uVar40 = uVar40 - 1;
                            uVar52 = uVar36 + 1;
                          } while (bVar63);
                          psVar61[bVar13] = sVar39;
                          uVar36 = uVar36 + 1;
LAB_00159519:
                        } while ((int)uVar36 <= iVar22);
                      }
                      else {
                        psVar27->eob_run = iVar22 + -1;
                        uVar58 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                        for (; (long)uVar36 <= (long)psVar27->spec_end; uVar36 = uVar36 + 1) {
                          bVar12 = ""[uVar36];
                          if (((psVar61[bVar12] != 0) &&
                              (iVar21 = stbi__jpeg_get_bit(psVar27), iVar21 != 0)) &&
                             (sVar39 = psVar61[bVar12], (uVar58 & (int)sVar39) == 0)) {
                            uVar40 = -uVar58;
                            if (0 < sVar39) {
                              uVar40 = uVar58;
                            }
                            psVar61[bVar12] = (short)uVar40 + sVar39;
                          }
                        }
                      }
                    }
                    iVar21 = psVar27->todo;
                    psVar27->todo = iVar21 + -1;
                    if (iVar21 < 2) {
                      if (psVar27->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar27);
                      }
                      bVar12 = psVar27->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_00159add;
                      stbi__jpeg_reset(psVar27);
                    }
                  }
                }
              }
              else {
                for (iVar19 = 0; iVar19 < psVar27->img_mcu_y; iVar19 = iVar19 + 1) {
                  for (iVar26 = 0; iVar26 < psVar27->img_mcu_x; iVar26 = iVar26 + 1) {
                    for (lVar29 = 0; lVar29 < psVar27->scan_n; lVar29 = lVar29 + 1) {
                      iVar49 = psVar27->order[lVar29];
                      for (iVar43 = 0; iVar43 < paVar1[iVar49].v; iVar43 = iVar43 + 1) {
                        iVar44 = 0;
                        while (iVar44 < paVar1[iVar49].h) {
                          iVar21 = stbi__jpeg_decode_block_prog_dc
                                             (psVar27,paVar1[iVar49].coeff +
                                                      (paVar1[iVar49].h * iVar26 + iVar44 +
                                                      (paVar1[iVar49].v * iVar19 + iVar43) *
                                                      paVar1[iVar49].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar27->huff_dc[paVar1[iVar49].hd].fast,iVar49);
                          iVar44 = iVar44 + 1;
                          if (iVar21 == 0) goto LAB_0015a818;
                        }
                      }
                    }
                    iVar49 = psVar27->todo;
                    psVar27->todo = iVar49 + -1;
                    if (iVar49 < 2) {
                      if (psVar27->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar27);
                      }
                      bVar12 = psVar27->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_00159add;
                      stbi__jpeg_reset(psVar27);
                    }
                  }
                }
              }
              bVar12 = psVar27->marker;
LAB_00159add:
              if (bVar12 == 0xff) {
                do {
                  iVar19 = stbi__at_eof(psVar27->s);
                  if (iVar19 != 0) goto LAB_001590a5;
                  sVar14 = stbi__get8(psVar27->s);
                } while (sVar14 != 0xff);
                sVar14 = stbi__get8(psVar27->s);
                psVar27->marker = sVar14;
              }
              goto LAB_001590a5;
            }
            pcVar28 = "bad SOS";
            goto LAB_0015a80f;
          }
          pcVar28 = "bad SOS len";
        }
        goto LAB_0015a80f;
      }
LAB_0015a818:
      stbi__cleanup_jpeg(psVar27);
    }
    else {
      pcVar28 = "bad req_comp";
LAB_00158f5f:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar28;
    }
    data_00 = (stbi__context *)0x0;
    goto LAB_0015a827;
  }
  iVar19 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    if ((uint)req_comp < 5) {
      data._0_8_ = s;
      iVar19 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
      uVar8 = data._0_8_;
      if (iVar19 == 0) {
        data_00 = (stbi__context *)0x0;
      }
      else {
        iVar19 = 8;
        if (8 < (int)data._32_4_) {
          iVar19 = data._32_4_;
        }
        ri->bits_per_channel = iVar19;
        if ((req_comp != 0) && (iVar19 = *(int *)(data._0_8_ + 0xc), iVar19 != req_comp)) {
          if ((int)data._32_4_ < 9) {
            data._24_8_ = stbi__convert_format
                                    ((uchar *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                     *(uint *)(data._0_8_ + 4));
          }
          else {
            data._24_8_ = stbi__convert_format16
                                    ((stbi__uint16 *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_
                                     ,*(uint *)(data._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if ((stbi__context *)data._24_8_ == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar8;
        *y = *(int *)(uVar8 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar8 + 8);
        }
        data_00 = (stbi__context *)data._24_8_;
        data._24_8_ = (void *)0x0;
      }
      free((void *)data._24_8_);
      free((void *)data._16_8_);
      psVar27 = (stbi__jpeg *)data._8_8_;
      goto LAB_0015a827;
    }
    pcVar28 = "bad req_comp";
    goto LAB_00158fb4;
  }
  sVar14 = stbi__get8(s);
  if ((sVar14 == 'B') && (sVar14 = stbi__get8(s), sVar14 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar20 = stbi__get32le(s);
    if (((0x38 < sVar20) || ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) == 0)) &&
       ((sVar20 != 0x7c && (sVar20 != 0x6c)))) goto LAB_00159cc8;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    coutput[3] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[3]);
    pvVar32 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
    if (pvVar32 == (void *)0x0) {
      return (void *)0x0;
    }
    sVar20 = s->img_y;
    sVar24 = -sVar20;
    if (0 < (int)sVar20) {
      sVar24 = sVar20;
    }
    s->img_y = sVar24;
    uVar58 = (uint)coutput[3];
    local_8960 = coutput[3]._4_4_;
    if ((int)coutput[1] == 0xc) {
      if (0x17 < (int)coutput[0]) goto LAB_00159f38;
      uVar40 = (int)((coutput[0]._4_4_ - local_88d8) + -0x18) / 3;
LAB_00159f26:
      if (uVar40 == 0) goto LAB_00159f38;
      bVar63 = false;
LAB_00159f8f:
      bVar11 = (uint)coutput[3] == 0xff000000;
      iVar26 = 4 - (uint)((uint)coutput[3] == 0);
      iVar19 = (int)coutput[0];
    }
    else {
      if ((int)coutput[0] < 0x10) {
        uVar40 = (int)(coutput[0]._4_4_ - (local_88d8 + (int)coutput[1])) >> 2;
        goto LAB_00159f26;
      }
LAB_00159f38:
      if (s->img_buffer + (-0x38 - (long)s) != (stbi_uc *)(long)(int)coutput[0]._4_4_) {
        __assert_fail("info.offset == (s->img_buffer - s->buffer_start)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                      ,0x14de,
                      "void *stbi__bmp_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                     );
      }
      uVar40 = 0;
      bVar63 = true;
      if ((int)coutput[0] != 0x18 || (uint)coutput[3] != 0xff000000) goto LAB_00159f8f;
      bVar11 = true;
      uVar40 = 0;
      iVar26 = 3;
      iVar19 = 0x18;
      bVar63 = true;
    }
    s->img_n = iVar26;
    if (2 < req_comp) {
      iVar26 = req_comp;
    }
    sVar50 = s->img_x;
    iVar49 = stbi__mad3sizes_valid(iVar26,sVar50,sVar24,0);
    if (iVar49 != 0) {
      puVar30 = (uchar *)stbi__malloc_mad3(iVar26,sVar50,sVar24,0);
      if (puVar30 != (uchar *)0x0) {
        if (iVar19 < 0x10) {
          if (!bVar63 && (int)uVar40 < 0x101) {
            uVar52 = 0;
            uVar36 = 0;
            if (0 < (int)uVar40) {
              uVar36 = (ulong)uVar40;
            }
            for (; uVar36 != uVar52; uVar52 = uVar52 + 1) {
              sVar14 = stbi__get8(s);
              *(stbi_uc *)(data + uVar52 * 2 + 1) = sVar14;
              sVar14 = stbi__get8(s);
              *(stbi_uc *)((long)data + uVar52 * 4 + 1) = sVar14;
              sVar14 = stbi__get8(s);
              *(stbi_uc *)(data + uVar52 * 2) = sVar14;
              if ((int)coutput[1] != 0xc) {
                stbi__get8(s);
              }
              *(undefined1 *)((long)data + uVar52 * 4 + 3) = 0xff;
            }
            stbi__skip(s,(uVar40 * ((int)coutput[1] == 0xc | 0xfffffffc) + coutput[0]._4_4_) -
                         ((int)coutput[1] + local_88d8));
            if (iVar19 == 1) {
              sVar50 = s->img_x;
              iVar19 = 0;
              uVar36 = 0;
LAB_0015b714:
              sVar24 = s->img_y;
              if (iVar19 < (int)sVar24) {
                iVar49 = 0;
                do {
                  bVar12 = stbi__get8(s);
                  sVar24 = s->img_x;
                  iVar43 = 8;
                  do {
                    if ((int)sVar24 <= iVar49) {
LAB_0015b7b3:
                      uVar36 = uVar36 & 0xffffffff;
                      stbi__skip(s,-(sVar50 + 7 >> 3) & 3);
                      iVar19 = iVar19 + 1;
                      goto LAB_0015b714;
                    }
                    uVar52 = (ulong)((bVar12 >> (iVar43 - 1U & 0x1f) & 1) != 0);
                    iVar44 = (int)uVar36;
                    lVar29 = (long)iVar44;
                    uVar36 = lVar29 + 3;
                    puVar30[lVar29] = (uchar)data[uVar52 * 2];
                    puVar30[lVar29 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
                    puVar30[lVar29 + 2] = (uchar)data[uVar52 * 2 + 1];
                    if (iVar26 == 4) {
                      puVar30[lVar29 + 3] = 0xff;
                      uVar36 = (ulong)(iVar44 + 4);
                    }
                    if (sVar24 - 1 == iVar49) goto LAB_0015b7b3;
                    iVar49 = iVar49 + 1;
                    iVar44 = iVar43 + -1;
                    bVar63 = 0 < iVar43;
                    iVar43 = iVar44;
                  } while (iVar44 != 0 && bVar63);
                } while( true );
              }
            }
            else {
              if (iVar19 == 8) {
                sVar50 = s->img_x;
              }
              else {
                if (iVar19 != 4) {
                  free(puVar30);
                  pcVar28 = "bad bpp";
                  goto LAB_00158fb4;
                }
                sVar50 = s->img_x + 1 >> 1;
              }
              uVar36 = 0;
              for (iVar49 = 0; sVar24 = s->img_y, iVar49 < (int)sVar24; iVar49 = iVar49 + 1) {
                for (iVar43 = 0; iVar43 < (int)s->img_x; iVar43 = iVar43 + 2) {
                  bVar12 = stbi__get8(s);
                  uVar58 = (uint)(bVar12 >> 4);
                  if (iVar19 != 4) {
                    uVar58 = (uint)bVar12;
                  }
                  uVar52 = (ulong)uVar58;
                  uVar58 = bVar12 & 0xf;
                  if (iVar19 != 4) {
                    uVar58 = 0;
                  }
                  lVar29 = (long)(int)uVar36;
                  uVar46 = lVar29 + 3;
                  puVar30[lVar29] = (uchar)data[uVar52 * 2];
                  puVar30[lVar29 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
                  puVar30[lVar29 + 2] = (uchar)data[uVar52 * 2 + 1];
                  if (iVar26 == 4) {
                    puVar30[lVar29 + 3] = 0xff;
                    uVar46 = (ulong)((int)uVar36 + 4);
                  }
                  if (iVar43 + 1U == s->img_x) {
                    uVar36 = uVar46 & 0xffffffff;
                    break;
                  }
                  if (iVar19 == 8) {
                    bVar12 = stbi__get8(s);
                    uVar58 = (uint)bVar12;
                  }
                  lVar29 = (long)(int)uVar46;
                  uVar36 = lVar29 + 3;
                  uVar52 = (ulong)uVar58;
                  puVar30[lVar29] = (uchar)data[uVar52 * 2];
                  puVar30[lVar29 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
                  puVar30[lVar29 + 2] = (uchar)data[uVar52 * 2 + 1];
                  if (iVar26 == 4) {
                    puVar30[lVar29 + 3] = 0xff;
                    uVar36 = (ulong)((int)uVar46 + 4);
                  }
                }
                stbi__skip(s,-sVar50 & 3);
              }
            }
            goto LAB_0015b7cd;
          }
          free(puVar30);
          pcVar28 = "invalid";
          goto LAB_00158fb4;
        }
        stbi__skip(s,coutput[0]._4_4_ - ((int)coutput[1] + local_88d8));
        if (iVar19 == 0x10) {
          local_88fc = s->img_x * 2 & 2;
LAB_0015ab41:
          if (coutput[2]._4_4_ == 0 || ((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0)) {
            free(puVar30);
            pcVar28 = "bad masks";
            goto LAB_00158fb4;
          }
          iVar49 = stbi__high_bit(coutput[1]._4_4_);
          iVar49 = iVar49 + -7;
          local_8928 = stbi__bitcount(coutput[1]._4_4_);
          iVar43 = stbi__high_bit((uint)coutput[2]);
          iVar43 = iVar43 + -7;
          iVar44 = stbi__bitcount((uint)coutput[2]);
          iVar21 = stbi__high_bit(coutput[2]._4_4_);
          iVar21 = iVar21 + -7;
          local_88bc = stbi__bitcount(coutput[2]._4_4_);
          local_88c0 = stbi__high_bit(uVar58);
          local_88c0 = local_88c0 + -7;
          local_88c4 = stbi__bitcount(uVar58);
          bVar11 = true;
          bVar63 = false;
        }
        else {
          if (iVar19 == 0x20) {
            local_88fc = 0;
            if (!(bool)(bVar11 & (coutput[1]._4_4_ == 0xff0000 &&
                                 ((uint)coutput[2] == 0xff00 && coutput[2]._4_4_ == 0xff))))
            goto LAB_0015ab41;
            bVar63 = true;
          }
          else {
            local_88fc = 0;
            if (iVar19 != 0x18) goto LAB_0015ab41;
            local_88fc = s->img_x & 3;
            bVar63 = false;
          }
          bVar11 = false;
          iVar49 = 0;
          iVar43 = 0;
          iVar21 = 0;
          local_88c0 = 0;
          local_8928 = 0;
          iVar44 = 0;
          local_88bc = 0;
          local_88c4 = 0;
        }
        iVar23 = 0;
        for (iVar22 = 0; sVar24 = s->img_y, iVar22 < (int)sVar24; iVar22 = iVar22 + 1) {
          if (bVar11) {
            for (iVar51 = 0; iVar51 < (int)s->img_x; iVar51 = iVar51 + 1) {
              if (iVar19 == 0x10) {
                uVar40 = stbi__get16le(s);
              }
              else {
                uVar40 = stbi__get32le(s);
              }
              iVar25 = stbi__shiftsigned(uVar40 & coutput[1]._4_4_,iVar49,local_8928);
              puVar30[iVar23] = (uchar)iVar25;
              iVar25 = stbi__shiftsigned(uVar40 & (uint)coutput[2],iVar43,iVar44);
              puVar30[(long)iVar23 + 1] = (uchar)iVar25;
              iVar25 = stbi__shiftsigned(uVar40 & coutput[2]._4_4_,iVar21,local_88bc);
              puVar30[(long)iVar23 + 2] = (uchar)iVar25;
              if (uVar58 == 0) {
                uVar40 = 0xff;
              }
              else {
                uVar40 = stbi__shiftsigned(uVar40 & uVar58,local_88c0,local_88c4);
              }
              iVar25 = iVar23 + 3;
              if (iVar26 == 4) {
                puVar30[(long)iVar23 + 3] = (uchar)uVar40;
                iVar25 = iVar23 + 4;
              }
              iVar23 = iVar25;
              local_8960 = local_8960 | uVar40;
            }
          }
          else {
            for (iVar51 = 0; iVar51 < (int)s->img_x; iVar51 = iVar51 + 1) {
              sVar14 = stbi__get8(s);
              puVar30[(long)iVar23 + 2] = sVar14;
              sVar14 = stbi__get8(s);
              puVar30[(long)iVar23 + 1] = sVar14;
              sVar14 = stbi__get8(s);
              puVar30[iVar23] = sVar14;
              bVar12 = 0xff;
              if (bVar63) {
                bVar12 = stbi__get8(s);
              }
              iVar25 = iVar23 + 3;
              if (iVar26 == 4) {
                puVar30[(long)iVar23 + 3] = bVar12;
                iVar25 = iVar23 + 4;
              }
              iVar23 = iVar25;
              local_8960 = local_8960 | bVar12;
            }
          }
          stbi__skip(s,local_88fc);
        }
LAB_0015b7cd:
        if ((iVar26 == 4) && (local_8960 == 0)) {
          for (uVar58 = s->img_x * sVar24 * 4 - 1; -1 < (int)uVar58; uVar58 = uVar58 - 4) {
            puVar30[uVar58] = 0xff;
          }
        }
        if (0 < (int)sVar20) {
          iVar19 = (int)sVar24 >> 1;
          if ((int)sVar24 >> 1 < 1) {
            iVar19 = 0;
          }
          iVar49 = (sVar24 - 1) * iVar26;
          iVar44 = 0;
          for (iVar43 = 0; iVar43 != iVar19; iVar43 = iVar43 + 1) {
            sVar20 = s->img_x;
            uVar36 = (ulong)(sVar20 * iVar26);
            if ((int)(sVar20 * iVar26) < 1) {
              uVar36 = 0;
            }
            for (uVar52 = 0; uVar36 != uVar52; uVar52 = uVar52 + 1) {
              uVar4 = puVar30[uVar52 + sVar20 * iVar44];
              puVar30[uVar52 + sVar20 * iVar44] = puVar30[uVar52 + sVar20 * iVar49];
              puVar30[uVar52 + sVar20 * iVar49] = uVar4;
            }
            iVar49 = iVar49 - iVar26;
            iVar44 = iVar44 + iVar26;
          }
        }
        uVar58 = s->img_x;
        if ((req_comp != 0) && (iVar26 != req_comp)) {
          puVar30 = stbi__convert_format(puVar30,iVar26,req_comp,uVar58,sVar24);
          if (puVar30 == (uchar *)0x0) {
            return (void *)0x0;
          }
          uVar58 = s->img_x;
        }
        *x = uVar58;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return puVar30;
        }
        return puVar30;
      }
      goto LAB_0015aa8c;
    }
LAB_0015beb1:
    pcVar28 = "too large";
    goto LAB_00158fb4;
  }
LAB_00159cc8:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__gif_test(s);
  if (iVar19 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    data_00 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar35);
    if (data_00 == (stbi__context *)0x0 || data_00 == s) {
      free((void *)data._8_8_);
      data_00 = (stbi__context *)0x0;
    }
    else {
      *x = data._0_4_;
      *y = data._4_4_;
      if ((req_comp & 0xfffffffbU) != 0) {
        data_00 = (stbi__context *)
                  stbi__convert_format((uchar *)data_00,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    psVar27 = (stbi__jpeg *)data._16_8_;
    goto LAB_0015a827;
  }
  sVar20 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar20 == 0x38425053) {
    sVar20 = stbi__get32be(s);
    if (sVar20 != 0x38425053) {
      pcVar28 = "not PSD";
      goto LAB_00158fb4;
    }
    iVar19 = stbi__get16be(s);
    if (iVar19 != 1) {
      pcVar28 = "wrong version";
      goto LAB_00158fb4;
    }
    stbi__skip(s,6);
    uVar58 = stbi__get16be(s);
    if (0x10 < uVar58) {
      pcVar28 = "wrong channel count";
      goto LAB_00158fb4;
    }
    sVar20 = stbi__get32be(s);
    sVar24 = stbi__get32be(s);
    iVar19 = stbi__get16be(s);
    if ((iVar19 != 8) && (iVar19 != 0x10)) {
      pcVar28 = "unsupported bit depth";
      goto LAB_00158fb4;
    }
    iVar26 = stbi__get16be(s);
    if (iVar26 != 3) {
      pcVar28 = "wrong color format";
      goto LAB_00158fb4;
    }
    sVar50 = stbi__get32be(s);
    stbi__skip(s,sVar50);
    sVar50 = stbi__get32be(s);
    stbi__skip(s,sVar50);
    sVar50 = stbi__get32be(s);
    stbi__skip(s,sVar50);
    uVar40 = stbi__get16be(s);
    if (1 < uVar40) {
      pcVar28 = "bad compression";
      goto LAB_00158fb4;
    }
    iVar26 = stbi__mad3sizes_valid(4,sVar24,sVar20,0);
    if (iVar26 == 0) goto LAB_0015beb1;
    if (((bpc == 0x10) && (iVar19 == 0x10)) && (uVar40 == 0)) {
      data_01 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar24,sVar20,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      data_01 = (stbi__uint16 *)malloc((long)(int)(sVar20 * sVar24 * 4));
    }
    if (data_01 != (stbi__uint16 *)0x0) {
      uVar59 = sVar24 * sVar20;
      if (uVar40 == 0) {
        uVar36 = 0;
        psVar62 = data_01;
        local_8988 = data_01;
        uVar40 = 0;
        if (0 < (int)uVar59) {
          uVar40 = uVar59;
        }
        for (; uVar36 != 4; uVar36 = uVar36 + 1) {
          if (uVar36 < uVar58) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar29 = 0; uVar40 != (uint)lVar29; lVar29 = lVar29 + 1) {
                iVar26 = stbi__get16be(s);
                local_8988[lVar29 * 4] = (stbi__uint16)iVar26;
              }
            }
            else {
              lVar29 = 0;
              if (iVar19 == 0x10) {
                for (; uVar40 != (uint)lVar29; lVar29 = lVar29 + 1) {
                  iVar26 = stbi__get16be(s);
                  *(char *)(psVar62 + lVar29 * 2) = (char)((uint)iVar26 >> 8);
                }
              }
              else {
                for (; uVar40 != (uint)lVar29; lVar29 = lVar29 + 1) {
                  sVar14 = stbi__get8(s);
                  *(stbi_uc *)(psVar62 + lVar29 * 2) = sVar14;
                }
              }
            }
          }
          else if (iVar19 == 0x10 && bpc == 0x10) {
            for (lVar29 = 0; uVar40 != (uint)lVar29; lVar29 = lVar29 + 1) {
              local_8988[lVar29 * 4] = -(ushort)(uVar36 == 3);
            }
          }
          else {
            for (lVar29 = 0; uVar40 != (uint)lVar29; lVar29 = lVar29 + 1) {
              *(char *)(psVar62 + lVar29 * 2) = -(uVar36 == 3);
            }
          }
          psVar62 = (stbi__uint16 *)((long)psVar62 + 1);
          local_8988 = local_8988 + 1;
        }
      }
      else {
        stbi__skip(s,sVar20 * uVar58 * 2);
        uVar36 = 0;
        psVar62 = data_01;
        uVar40 = 0;
        if (0 < (int)uVar59) {
          uVar40 = uVar59;
        }
        for (; uVar36 != 4; uVar36 = uVar36 + 1) {
          if (uVar36 < uVar58) {
            psVar35 = (stbi_uc *)((long)data_01 + uVar36);
            iVar19 = 0;
            do {
              uVar55 = uVar59 - iVar19;
              do {
                if ((int)uVar55 < 1) goto LAB_0015ba6b;
                bVar12 = stbi__get8(s);
              } while (bVar12 == 0x80);
              uVar60 = (uint)bVar12;
              if ((char)bVar12 < '\0') {
                uVar54 = 0x101 - uVar60;
                if (uVar55 < uVar54) goto LAB_0015bfe2;
                sVar14 = stbi__get8(s);
                for (iVar26 = uVar60 - 0x101; iVar26 != 0; iVar26 = iVar26 + 1) {
                  *psVar35 = sVar14;
                  psVar35 = psVar35 + 4;
                }
              }
              else {
                if (uVar55 <= bVar12) {
LAB_0015bfe2:
                  free(data_01);
                  pcVar28 = "corrupt";
                  goto LAB_00158fb4;
                }
                uVar54 = uVar60 + 1;
                uVar55 = uVar54;
                while (bVar63 = uVar55 != 0, uVar55 = uVar55 - 1, bVar63) {
                  sVar14 = stbi__get8(s);
                  *psVar35 = sVar14;
                  psVar35 = psVar35 + 4;
                }
              }
              iVar19 = iVar19 + uVar54;
            } while( true );
          }
          for (lVar29 = 0; uVar40 != (uint)lVar29; lVar29 = lVar29 + 1) {
            *(char *)(psVar62 + lVar29 * 2) = -(uVar36 == 3);
          }
LAB_0015ba6b:
          psVar62 = (stbi__uint16 *)((long)psVar62 + 1);
        }
      }
      if (3 < uVar58) {
        uVar36 = 0;
        if (0 < (int)uVar59) {
          uVar36 = (ulong)uVar59;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar52 = 0; uVar36 != uVar52; uVar52 = uVar52 + 1) {
            uVar7 = data_01[uVar52 * 4 + 3];
            if ((uVar7 != 0) && (uVar7 != 0xffff)) {
              fVar65 = 1.0 / ((float)uVar7 / 65535.0);
              fVar64 = (1.0 - fVar65) * 65535.0;
              auVar66._0_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(data_01 + uVar52 * 4) & 0xffff));
              auVar66._4_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(data_01 + uVar52 * 4) >> 0x10));
              auVar66._8_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66._12_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66 = pshuflw(auVar66,auVar66,0xe8);
              *(int *)(data_01 + uVar52 * 4) = auVar66._0_4_;
              data_01[uVar52 * 4 + 2] =
                   (stbi__uint16)(int)((float)data_01[uVar52 * 4 + 2] * fVar65 + fVar64);
            }
          }
        }
        else {
          for (uVar52 = 0; uVar36 != uVar52; uVar52 = uVar52 + 1) {
            bVar12 = *(byte *)((long)data_01 + uVar52 * 4 + 3);
            if ((bVar12 != 0) && (bVar12 != 0xff)) {
              fVar65 = 1.0 / ((float)bVar12 / 255.0);
              fVar64 = (1.0 - fVar65) * 255.0;
              *(char *)(data_01 + uVar52 * 2) =
                   (char)(int)((float)(byte)data_01[uVar52 * 2] * fVar65 + fVar64);
              *(char *)((long)data_01 + uVar52 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)data_01 + uVar52 * 4 + 1) * fVar65 + fVar64);
              *(char *)(data_01 + uVar52 * 2 + 1) =
                   (char)(int)((float)(byte)data_01[uVar52 * 2 + 1] * fVar65 + fVar64);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          data_01 = stbi__convert_format16(data_01,4,req_comp,sVar24,sVar20);
        }
        else {
          data_01 = (stbi__uint16 *)stbi__convert_format((uchar *)data_01,4,req_comp,sVar24,sVar20);
        }
        if (data_01 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar20;
      *x = sVar24;
      return data_01;
    }
  }
  else {
    iVar19 = stbi__pic_is4(s,anon_var_dwarf_1232);
    if (iVar19 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar19 = 0x54;
      while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
        stbi__get8(s);
      }
      iVar19 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar19 != 0) {
        iVar19 = 0x5c;
        while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
          stbi__get8(s);
        }
        uVar58 = stbi__get16be(s);
        uVar40 = stbi__get16be(s);
        iVar19 = stbi__at_eof(s);
        if (iVar19 != 0) {
          pcVar28 = "bad file";
          goto LAB_00158fb4;
        }
        bVar12 = 0;
        iVar19 = stbi__mad3sizes_valid(uVar58,uVar40,4,0);
        if (iVar19 != 0) {
          stbi__get32be(s);
          stbi__get16be(s);
          stbi__get16be(s);
          psVar27 = (stbi__jpeg *)stbi__malloc_mad3(uVar58,uVar40,4,0);
          uVar59 = uVar58 * 4;
          memset(psVar27,0xff,(ulong)(uVar59 * uVar40));
          pbVar56 = (byte *)(data + 1);
          lVar29 = 0;
          psVar42 = (stbi__context *)(ulong)uVar59;
          do {
            if (lVar29 == 10) {
LAB_0015aa78:
              s = psVar42;
              pcVar28 = "bad format";
LAB_0015b5c0:
              iVar19 = (int)s;
              *(char **)(in_FS_OFFSET + -0x10) = pcVar28;
              goto LAB_0015bb75;
            }
            sVar14 = stbi__get8(s);
            bVar13 = stbi__get8(s);
            pbVar56[-2] = bVar13;
            bVar16 = stbi__get8(s);
            pbVar56[-1] = bVar16;
            bVar16 = stbi__get8(s);
            *pbVar56 = bVar16;
            iVar19 = stbi__at_eof(s);
            if (iVar19 != 0) {
              pcVar28 = "bad file";
              goto LAB_0015b5c0;
            }
            psVar42 = s;
            if (bVar13 != 8) goto LAB_0015aa78;
            bVar12 = bVar12 | bVar16;
            pbVar56 = pbVar56 + 3;
            lVar29 = lVar29 + 1;
          } while (sVar14 != '\0');
          iVar19 = 4 - (uint)((bVar12 & 0x10) == 0);
          if (comp != (int *)0x0) {
            *comp = iVar19;
          }
          for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
            psVar35 = psVar27->huff_dc[0].fast + (long)(int)(uVar59 * (int)uVar36) + -8;
            for (lVar45 = 0; lVar29 != lVar45; lVar45 = lVar45 + 1) {
              lVar9 = lVar45 * 3;
              cVar3 = *(char *)((long)data + lVar9 + 1);
              psVar53 = psVar35;
              uVar55 = uVar58;
              if (cVar3 != '\0') {
                if (cVar3 == '\x01') {
                  for (; 0 < (int)uVar55; uVar55 = uVar55 - (uVar60 & 0xff)) {
                    bVar12 = stbi__get8(s);
                    iVar26 = stbi__at_eof(s);
                    if (iVar26 != 0) goto LAB_0015bb52;
                    psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),
                                            (stbi_uc *)coutput);
                    if (psVar31 == (stbi_uc *)0x0) goto LAB_0015bb75;
                    uVar60 = (uint)bVar12;
                    if (uVar55 < bVar12) {
                      uVar60 = uVar55;
                    }
                    uVar54 = uVar60 & 0xff;
                    while (bVar63 = uVar54 != 0, uVar54 = uVar54 - 1, bVar63) {
                      stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar53,
                                    (stbi_uc *)coutput);
                      psVar53 = psVar53 + 4;
                    }
                  }
                  goto LAB_0015a7da;
                }
                if (cVar3 == '\x02') {
                  for (; 0 < (int)uVar55; uVar55 = uVar55 - iVar26) {
                    bVar12 = stbi__get8(s);
                    iVar26 = stbi__at_eof(s);
                    if (iVar26 != 0) goto LAB_0015bb52;
                    uVar60 = (uint)bVar12;
                    if ((char)bVar12 < '\0') {
                      if (uVar60 == 0x80) {
                        iVar26 = stbi__get16be(s);
                      }
                      else {
                        iVar26 = uVar60 - 0x7f;
                      }
                      if ((int)uVar55 < iVar26) goto LAB_0015bb52;
                      psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),
                                              (stbi_uc *)coutput);
                      iVar49 = iVar26;
                      if (psVar31 == (stbi_uc *)0x0) goto LAB_0015bb75;
                      while (iVar49 != 0) {
                        stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar53,
                                      (stbi_uc *)coutput);
                        psVar53 = psVar53 + 4;
                        iVar49 = iVar49 + -1;
                      }
                    }
                    else {
                      iVar26 = bVar12 + 1;
                      iVar49 = iVar26;
                      if (uVar55 <= uVar60) goto LAB_0015bb52;
                      while (bVar63 = iVar49 != 0, iVar49 = iVar49 + -1, bVar63) {
                        psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar53);
                        if (psVar31 == (stbi_uc *)0x0) goto LAB_0015bb75;
                        psVar53 = psVar53 + 4;
                      }
                    }
                  }
                  goto LAB_0015a7da;
                }
                pcVar28 = "bad format";
                goto LAB_0015bb59;
              }
              while (bVar63 = uVar55 != 0, uVar55 = uVar55 - 1, bVar63) {
                psVar31 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar53);
                if (psVar31 == (stbi_uc *)0x0) goto LAB_0015bb75;
                psVar53 = psVar53 + 4;
              }
LAB_0015a7da:
            }
          }
          if (psVar27 == (stbi__jpeg *)0x0) goto LAB_0015bb75;
          goto LAB_0015bb7c;
        }
        goto LAB_0015beb1;
      }
    }
    sVar14 = stbi__get8(s);
    sVar15 = stbi__get8(s);
    if ((sVar14 == 'P') && (0xfd < (byte)(sVar15 - 0x37))) {
      iVar19 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
      if (iVar19 == 0) {
        return (void *)0x0;
      }
      *x = s->img_x;
      sVar20 = s->img_y;
      *y = sVar20;
      iVar19 = s->img_n;
      if (comp != (int *)0x0) {
        *comp = iVar19;
        sVar20 = s->img_y;
      }
      sVar24 = s->img_x;
      iVar26 = stbi__mad3sizes_valid(iVar19,sVar24,sVar20,0);
      if (iVar26 == 0) goto LAB_0015beb1;
      puVar30 = (uchar *)stbi__malloc_mad3(iVar19,sVar24,sVar20,0);
      if (puVar30 != (uchar *)0x0) {
        stbi__getn(s,puVar30,sVar20 * iVar19 * sVar24);
        if (req_comp == 0) {
          return puVar30;
        }
        iVar19 = s->img_n;
        if (iVar19 != req_comp) {
          puVar30 = stbi__convert_format(puVar30,iVar19,req_comp,s->img_x,s->img_y);
          return puVar30;
        }
        return puVar30;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar19 = stbi__hdr_test(s);
      if (iVar19 == 0) {
        stbi__get8(s);
        bVar12 = stbi__get8(s);
        if (bVar12 < 2) {
          bVar13 = stbi__get8(s);
          if (bVar12 == 1) {
            if ((bVar13 & 0xf7) == 1) {
              iVar19 = 4;
              stbi__skip(s,4);
              bVar13 = stbi__get8(s);
              if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0))
              goto LAB_0015adb3;
            }
            goto LAB_0015a8ef;
          }
          if ((bVar13 & 0xf6) != 2) goto LAB_0015a8ef;
          iVar19 = 9;
LAB_0015adb3:
          stbi__skip(s,iVar19);
          iVar19 = stbi__get16le(s);
          if ((iVar19 == 0) || (iVar19 = stbi__get16le(s), iVar19 == 0)) goto LAB_0015a8ef;
          bVar13 = stbi__get8(s);
          if (bVar12 != 1) {
            if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0)) {
              s->img_buffer = s->img_buffer_original;
              s->img_buffer_end = s->img_buffer_original_end;
              goto LAB_0015baa0;
            }
            goto LAB_0015a8ef;
          }
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar13 - 8 & 0xf7) == 0) {
LAB_0015baa0:
            bVar13 = stbi__get8(s);
            sVar14 = stbi__get8(s);
            bVar16 = stbi__get8(s);
            iVar19 = stbi__get16le(s);
            uVar55 = stbi__get16le(s);
            bVar12 = stbi__get8(s);
            stbi__get16le(s);
            stbi__get16le(s);
            uVar58 = stbi__get16le(s);
            uVar40 = stbi__get16le(s);
            bVar17 = stbi__get8(s);
            data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
            bVar18 = stbi__get8(s);
            coutput[0] = (stbi_uc *)((ulong)coutput[0]._4_4_ << 0x20);
            if (sVar14 == '\0') {
              uVar59 = bVar16 - 8;
              if (bVar16 < 8) {
                uVar59 = (uint)bVar16;
              }
              uVar59 = (uint)(uVar59 == 3);
              bVar12 = bVar17;
            }
            else {
              uVar59 = 0;
            }
            uVar59 = stbi__tga_get_comp((uint)bVar12,uVar59,(int *)data);
            if (uVar59 == 0) {
              pcVar28 = "bad format";
              goto LAB_00158fb4;
            }
            *x = uVar58;
            *y = uVar40;
            if (comp != (int *)0x0) {
              *comp = uVar59;
            }
            iVar26 = stbi__mad3sizes_valid(uVar58,uVar40,uVar59,0);
            if (iVar26 == 0) goto LAB_0015beb1;
            psVar27 = (stbi__jpeg *)stbi__malloc_mad3(uVar58,uVar40,uVar59,0);
            if (psVar27 != (stbi__jpeg *)0x0) {
              stbi__skip(s,(uint)bVar13);
              uVar36 = (ulong)uVar59;
              if (((sVar14 == '\0') && (bVar16 < 8)) && (data._0_4_ == 0)) {
                uVar60 = 0;
                uVar55 = uVar40;
                while (uVar55 = uVar55 - 1, uVar55 != 0xffffffff) {
                  uVar54 = uVar60;
                  if ((bVar18 >> 5 & 1) == 0) {
                    uVar54 = uVar55;
                  }
                  stbi__getn(s,psVar27->huff_dc[0].fast + (long)(int)(uVar54 * uVar59 * uVar58) + -8
                             ,uVar59 * uVar58);
                  uVar60 = uVar60 + 1;
                }
              }
              else {
                if (sVar14 == '\0') {
                  local_8968 = (stbi_uc *)0x0;
                }
                else {
                  stbi__skip(s,iVar19);
                  local_8968 = (stbi_uc *)stbi__malloc_mad2(uVar55,uVar59,0);
                  if (local_8968 == (stbi_uc *)0x0) goto LAB_0015aa87;
                  if (data._0_4_ == 0) {
                    iVar19 = stbi__getn(s,local_8968,uVar59 * uVar55);
                    if (iVar19 == 0) {
                      free(psVar27);
                      free(local_8968);
                      pcVar28 = "bad palette";
                      goto LAB_00158fb4;
                    }
                  }
                  else {
                    if (uVar59 != 3) {
                      __assert_fail("tga_comp == STBI_rgb",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                                    ,0x164e,
                                    "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                   );
                    }
                    for (lVar29 = 0; uVar55 * 3 != (int)lVar29; lVar29 = lVar29 + 3) {
                      stbi__tga_read_rgb16(s,local_8968 + lVar29);
                    }
                  }
                }
                bVar63 = true;
                iVar19 = 0;
                uVar60 = 0;
                psVar48 = psVar27;
                for (uVar52 = 0; uVar52 != uVar40 * uVar58; uVar52 = uVar52 + 1) {
                  if (bVar16 < 8) {
LAB_0015c117:
                    if (sVar14 == '\0') {
                      if (data._0_4_ == 0) {
                        for (uVar46 = 0; uVar36 != uVar46; uVar46 = uVar46 + 1) {
                          sVar15 = stbi__get8(s);
                          *(stbi_uc *)((long)coutput + uVar46) = sVar15;
                        }
                      }
                      else {
                        if (uVar59 != 3) {
                          __assert_fail("tga_comp == STBI_rgb",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                                        ,0x167f,
                                        "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                       );
                        }
                        stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                      }
                    }
                    else {
                      if (bVar17 == 8) {
                        bVar12 = stbi__get8(s);
                        uVar54 = (uint)bVar12;
                      }
                      else {
                        uVar54 = stbi__get16le(s);
                      }
                      if (uVar55 <= uVar54) {
                        uVar54 = 0;
                      }
                      for (uVar46 = 0; uVar36 != uVar46; uVar46 = uVar46 + 1) {
                        *(stbi_uc *)((long)coutput + uVar46) = local_8968[uVar46 + uVar54 * uVar59];
                      }
                    }
                  }
                  else {
                    if (iVar19 == 0) {
                      bVar12 = stbi__get8(s);
                      iVar19 = (bVar12 & 0x7f) + 1;
                      uVar60 = (uint)(bVar12 >> 7);
                      goto LAB_0015c117;
                    }
                    if (uVar60 == 0 || bVar63) {
                      uVar60 = (uint)(uVar60 != 0);
                      goto LAB_0015c117;
                    }
                    uVar60 = 1;
                  }
                  for (uVar46 = 0; uVar36 != uVar46; uVar46 = uVar46 + 1) {
                    psVar48->huff_dc[0].fast[uVar46 - 8] = *(stbi_uc *)((long)coutput + uVar46);
                  }
                  iVar19 = iVar19 + -1;
                  psVar48 = (stbi__jpeg *)(psVar48->huff_dc[0].fast + (uVar36 - 8));
                  bVar63 = false;
                }
                if ((bVar18 >> 5 & 1) == 0) {
                  iVar19 = uVar59 * uVar58;
                  iVar26 = (uVar40 - 1) * iVar19;
                  uVar55 = 0;
                  for (uVar60 = 0; uVar60 != uVar40 + 1 >> 1; uVar60 = uVar60 + 1) {
                    psVar48 = psVar27;
                    for (iVar49 = iVar19; 0 < iVar49; iVar49 = iVar49 + -1) {
                      sVar14 = psVar48->huff_dc[0].fast[(ulong)uVar55 - 8];
                      psVar48->huff_dc[0].fast[(ulong)uVar55 - 8] =
                           psVar48->huff_dc[0].fast[(long)iVar26 + -8];
                      psVar48->huff_dc[0].fast[(long)iVar26 + -8] = sVar14;
                      psVar48 = (stbi__jpeg *)((long)&psVar48->s + 1);
                    }
                    uVar55 = uVar55 + iVar19;
                    iVar26 = iVar26 - iVar19;
                  }
                }
                free(local_8968);
              }
              if ((2 < uVar59) && (data._0_4_ == 0)) {
                iVar19 = uVar40 * uVar58;
                puVar38 = (undefined1 *)((long)&psVar27->s + 2);
                while (bVar63 = iVar19 != 0, iVar19 = iVar19 + -1, bVar63) {
                  uVar5 = puVar38[-2];
                  puVar38[-2] = *puVar38;
                  *puVar38 = uVar5;
                  puVar38 = puVar38 + uVar36;
                }
              }
              if (req_comp == 0) {
                return psVar27;
              }
              if (uVar59 == req_comp) {
                return psVar27;
              }
LAB_0015bbbc:
              puVar30 = stbi__convert_format((uchar *)psVar27,uVar59,req_comp,uVar58,uVar40);
              return puVar30;
            }
            goto LAB_0015aa8c;
          }
        }
        else {
LAB_0015a8ef:
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        pcVar28 = "unknown image type";
        goto LAB_00158fb4;
      }
      psVar27 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (psVar27 == (stbi__jpeg *)0x0) {
        return (void *)0x0;
      }
      iVar19 = *x;
      iVar26 = *y;
      data_00 = (stbi__context *)stbi__malloc_mad3(iVar19,iVar26,req_comp,0);
      if (data_00 != (stbi__context *)0x0) {
        uVar40 = (req_comp + (req_comp & 1U)) - 1;
        uVar58 = iVar26 * iVar19;
        uVar36 = (ulong)uVar40;
        if ((int)uVar40 < 1) {
          uVar36 = 0;
        }
        lVar29 = (long)req_comp;
        uVar52 = (ulong)uVar58;
        if ((int)uVar58 < 1) {
          uVar52 = 0;
        }
        psVar42 = data_00;
        psVar48 = psVar27;
        for (uVar46 = 0; uVar46 != uVar52; uVar46 = uVar46 + 1) {
          for (uVar41 = 0; uVar36 != uVar41; uVar41 = uVar41 + 1) {
            fVar64 = powf(*(float *)(psVar48->huff_dc[0].fast + uVar41 * 4 + -8) * stbi__h2l_scale_i
                          ,stbi__h2l_gamma_i);
            fVar65 = fVar64 * 255.0 + 0.5;
            fVar64 = 0.0;
            if (0.0 <= fVar65) {
              fVar64 = fVar65;
            }
            fVar65 = 255.0;
            if (fVar64 <= 255.0) {
              fVar65 = fVar64;
            }
            psVar42->buffer_start[uVar41 - 0x38] = (stbi_uc)(int)fVar65;
          }
          if ((int)uVar36 < req_comp) {
            lVar45 = uVar46 * lVar29 + uVar36;
            fVar65 = *(float *)(psVar27->huff_dc[0].fast + lVar45 * 4 + -8) * 255.0 + 0.5;
            fVar64 = 0.0;
            if (0.0 <= fVar65) {
              fVar64 = fVar65;
            }
            fVar65 = 255.0;
            if (fVar64 <= 255.0) {
              fVar65 = fVar64;
            }
            data_00->buffer_start[lVar45 + -0x38] = (stbi_uc)(int)fVar65;
          }
          psVar42 = (stbi__context *)(psVar42->buffer_start + lVar29 + -0x38);
          psVar48 = (stbi__jpeg *)(psVar48->huff_dc[0].fast + lVar29 * 4 + -8);
        }
LAB_0015a827:
        free(psVar27);
        return data_00;
      }
LAB_0015aa87:
      free(psVar27);
    }
  }
LAB_0015aa8c:
  pcVar28 = "outofmem";
LAB_00158fb4:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar28;
  return (void *)0x0;
LAB_0015a17c:
  pcVar28 = "bad huffman code";
LAB_0015a80f:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar28;
  goto LAB_0015a818;
LAB_001590a5:
  bVar12 = stbi__get_marker(psVar27);
  goto LAB_00159042;
LAB_0015bb52:
  pcVar28 = "bad file";
LAB_0015bb59:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar28;
LAB_0015bb75:
  free(psVar27);
  psVar27 = (stbi__jpeg *)0x0;
LAB_0015bb7c:
  *x = uVar58;
  *y = uVar40;
  bVar63 = req_comp != 0;
  if (bVar63) {
    iVar19 = req_comp;
  }
  req_comp = iVar19;
  if (!bVar63 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar59 = 4;
  goto LAB_0015bbbc;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

#ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
#else
   STBI_NOTUSED(bpc);
#endif
#ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
#endif

#ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
#endif

#ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
#endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}